

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http2.c
# Opt level: O1

int on_frame_send(nghttp2_session *session,nghttp2_frame *frame,void *userp)

{
  int iVar1;
  Curl_easy *data;
  char buffer [256];
  char acStack_118 [256];
  
  if (userp == (void *)0x0) {
    data = (Curl_easy *)0x0;
  }
  else {
    data = *(Curl_easy **)(*(long *)((long)userp + 0x10) + 0x10);
  }
  if ((((data != (Curl_easy *)0x0) && (userp != (void *)0x0)) &&
      ((*(ulong *)&(data->set).field_0x8ba & 0x10000000) != 0)) && (0 < *(int *)(*userp + 0xc))) {
    iVar1 = fr_print(frame,acStack_118,(size_t)userp);
    acStack_118[iVar1] = '\0';
    if ((((data->set).field_0x8bd & 0x10) != 0) && (0 < *(int *)(*userp + 0xc))) {
      Curl_trc_cf_infof(data,(Curl_cfilter *)userp,"[%d] -> %s",(ulong)(uint)(frame->hd).stream_id,
                        acStack_118);
    }
  }
  return 0;
}

Assistant:

static int on_frame_send(nghttp2_session *session, const nghttp2_frame *frame,
                         void *userp)
{
  struct Curl_cfilter *cf = userp;
  struct Curl_easy *data = CF_DATA_CURRENT(cf);

  (void)session;
  DEBUGASSERT(data);
  if(data && Curl_trc_cf_is_verbose(cf, data)) {
    char buffer[256];
    int len;
    len = fr_print(frame, buffer, sizeof(buffer)-1);
    buffer[len] = 0;
    CURL_TRC_CF(data, cf, "[%d] -> %s", frame->hd.stream_id, buffer);
  }
  return 0;
}